

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_obj.cpp
# Opt level: O2

vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *
obj::load_from_stream<float>
          (vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
           *__return_storage_ptr__,istream *is)

{
  undefined8 uVar1;
  char *pcVar2;
  int iVar3;
  long *plVar4;
  optional<int> oVar5;
  ulong uVar6;
  _Storage<int,_true> _Var7;
  ulong uVar8;
  float *pfVar9;
  ulong uVar10;
  float fVar11;
  char *ptr;
  float y;
  float fStack_494;
  float local_490;
  vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>> *local_488;
  float z;
  vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> vertices;
  float x;
  Vec<float,_3UL> local_44c;
  char line [1024];
  
  (__return_storage_ptr__->
  super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertices.super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertices.super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488 = (vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>> *)
              __return_storage_ptr__;
  do {
    do {
      while( true ) {
        do {
          plVar4 = (long *)std::istream::getline((char *)is,(long)line);
          if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) {
            std::_Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
            ::~_Vector_base(&vertices.
                             super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                           );
            return (vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *)
                   local_488;
          }
          ptr = strip_spaces(line);
        } while ((*ptr == '\0') || (*ptr == '#'));
        remove_eol(ptr);
        pcVar2 = ptr;
        if (*ptr == 'f') break;
        if ((*ptr == 'v') && (iVar3 = isspace((int)ptr[1]), iVar3 != 0)) {
          x = strtof(pcVar2 + 1,&ptr);
          fVar11 = strtof(ptr,&ptr);
          y = fVar11;
          z = strtof(ptr,&ptr);
          std::vector<bvh::v2::Vec<float,3ul>,std::allocator<bvh::v2::Vec<float,3ul>>>::
          emplace_back<float&,float&,float&>
                    ((vector<bvh::v2::Vec<float,3ul>,std::allocator<bvh::v2::Vec<float,3ul>>> *)
                     &vertices,&x,&y,&z);
        }
      }
      iVar3 = isspace((int)ptr[1]);
    } while (iVar3 == 0);
    ptr = pcVar2 + 2;
    uVar10 = 0;
    pfVar9 = &x;
    while (oVar5 = read_index(&ptr),
          ((ulong)oVar5.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
      _Var7._M_value =
           oVar5.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _M_payload;
      if (_Var7._M_value < 0) {
        uVar6 = ((long)vertices.
                       super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)vertices.
                      super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0xc;
        uVar8 = (long)_Var7._M_value + uVar6;
      }
      else {
        uVar8 = (ulong)(_Var7._M_value + -1);
        uVar6 = ((long)vertices.
                       super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)vertices.
                      super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0xc;
      }
      if (uVar6 <= uVar8) {
        __assert_fail("j < vertices.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/test/load_obj.cpp"
                      ,0x50,
                      "std::vector<Tri<T, 3>> obj::load_from_stream(std::istream &) [T = float]");
      }
      local_490 = vertices.
                  super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar8].values[2];
      _y = *(undefined8 *)
            vertices.
            super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar8].values;
      if (uVar10 < 2) {
        uVar1 = *(undefined8 *)
                 vertices.
                 super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8].values;
        pfVar9[2] = vertices.
                    super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar8].values[2];
        *(undefined8 *)pfVar9 = uVar1;
      }
      else {
        std::vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>>::
        emplace_back<bvh::v2::Vec<float,3ul>&,bvh::v2::Vec<float,3ul>&,bvh::v2::Vec<float,3ul>&>
                  (local_488,(Vec<float,_3UL> *)&x,&local_44c,(Vec<float,_3UL> *)&y);
        local_44c.values[2] = local_490;
        local_44c.values[0] = y;
        local_44c.values[1] = fStack_494;
      }
      uVar10 = uVar10 + 1;
      pfVar9 = pfVar9 + 3;
    }
  } while( true );
}

Assistant:

inline std::vector<Tri<T, 3>> load_from_stream(std::istream& is) {
    static constexpr size_t max_line = 1024;
    char line[max_line];

    std::vector<Vec<T, 3>> vertices;
    std::vector<Tri<T, 3>> triangles;

    while (is.getline(line, max_line)) {
        char* ptr = strip_spaces(line);
        if (*ptr == '\0' || *ptr == '#')
            continue;
        remove_eol(ptr);
        if (*ptr == 'v' && std::isspace(ptr[1])) {
            auto x = std::strtof(ptr + 1, &ptr);
            auto y = std::strtof(ptr, &ptr);
            auto z = std::strtof(ptr, &ptr);
            vertices.emplace_back(x, y, z);
        } else if (*ptr == 'f' && std::isspace(ptr[1])) {
            Vec<T, 3> points[2];
            ptr += 2;
            for (size_t i = 0; ; ++i) {
                if (auto index = read_index(&ptr)) {
                    size_t j = *index < 0 ? vertices.size() + *index : *index - 1;
                    assert(j < vertices.size());
                    auto v = vertices[j];
                    if (i >= 2) {
                        triangles.emplace_back(points[0], points[1], v);
                        points[1] = v;
                    } else {
                        points[i] = v;
                    }
                } else {
                    break;
                }
            }
        }
    }

    return triangles;
}